

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_4::Validator::OnAtomicStoreExpr(Validator *this,AtomicStoreExpr *expr)

{
  Opcode opcode;
  Result RVar1;
  Address alignment;
  
  opcode.enum_ = (expr->opcode).enum_;
  alignment = Opcode::GetAlignment(&expr->opcode,expr->align);
  RVar1 = SharedValidator::OnAtomicStore
                    (&this->validator_,(Location *)&expr->field_0x18,opcode,alignment);
  (this->result_).enum_ = (uint)(RVar1.enum_ == Error || (this->result_).enum_ == Error);
  return (Result)Ok;
}

Assistant:

Result Validator::OnAtomicStoreExpr(AtomicStoreExpr* expr) {
  result_ |= validator_.OnAtomicStore(expr->loc, expr->opcode,
                                      expr->opcode.GetAlignment(expr->align));
  return Result::Ok;
}